

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cpp
# Opt level: O3

void __thiscall
SGParser::Generator::StdGrammarParseData::CreateVectors
          (StdGrammarParseData *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *grammarSymbols,
          vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
          *productions)

{
  size_t sVar1;
  char *__s;
  mapped_type *pmVar2;
  size_t i;
  long lVar3;
  long lVar4;
  int *piVar5;
  size_t sVar6;
  uint local_78 [2];
  uint arr [6];
  key_type local_58;
  allocator<char> local_35;
  uint local_34;
  
  piVar5 = &
           _ZZN8SGParser9Generator19StdGrammarParseData13CreateVectorsERSt3mapINSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEjSt4lessIS8_ESaISt4pairIKS8_jEEERSt6vectorINS0_10ProductionESaISI_EEE11terminalSet_rel
  ;
  lVar3 = 0;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               (char *)((long)&
                              _ZZN8SGParser9Generator19StdGrammarParseData13CreateVectorsERSt3mapINSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEjSt4lessIS8_ESaISt4pairIKS8_jEEERSt6vectorINS0_10ProductionESaISI_EEE11terminalSet_rel
                       + (long)*piVar5),(allocator<char> *)&local_34);
    local_78[0] = (uint)lVar3;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::insert_or_assign<unsigned_int>(grammarSymbols,&local_58,local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    lVar3 = lVar3 + 1;
    piVar5 = piVar5 + 1;
  } while (lVar3 != 0x2b);
  lVar3 = 8;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,*(char **)(&UNK_001613a8 + lVar3),(allocator<char> *)&local_34);
    local_78[0] = *(uint *)((long)&CreateVectors::nonTerminalSet[0].pName + lVar3) | 0x80000000;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::insert_or_assign<unsigned_int>(grammarSymbols,&local_58,local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x228);
  lVar4 = 0x1615e8;
  lVar3 = 0;
  do {
    sVar1 = CreateVectors::init[lVar3].Length;
    if (sVar1 != 0) {
      sVar6 = 0;
      do {
        __s = *(char **)(lVar4 + sVar6 * 8);
        if (__s != (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,__s,(allocator<char> *)&local_34);
          pmVar2 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::operator[](grammarSymbols,&local_58);
          local_78[sVar6] = *pmVar2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
        }
        sVar6 = sVar6 + 1;
      } while (sVar1 != sVar6);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,CreateVectors::init[lVar3].pGrammarSymbol,&local_35);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[](grammarSymbols,&local_58);
    local_34 = (uint)sVar1;
    std::vector<SGParser::Generator::Production,std::allocator<SGParser::Generator::Production>>::
    emplace_back<char_const*const&,unsigned_int&,unsigned_int(&)[6],unsigned_int>
              ((vector<SGParser::Generator::Production,std::allocator<SGParser::Generator::Production>>
                *)productions,&CreateVectors::init[lVar3].pName,pmVar2,(uint (*) [6])local_78,
               &local_34);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x48;
  } while (lVar3 != 0x6b);
  return;
}

Assistant:

void StdGrammarParseData::CreateVectors(std::map<String, unsigned>& grammarSymbols,
                                        std::vector<Production>& productions) {
    // Define a grammar. Notice the first production is the "augment" production
    // You've always got to have it since it tells the
    // parser the start symbol and creates an augmented grammar
    // Create a set of grammar symbols and productions to represent the grammar

    // *** Terminal set

    static constexpr size_t terminalCount = 43u;
    static constexpr const char* terminalSet[terminalCount] =
    {
      "ROOT_BLOCK'",
      "ROOT_BLOCK",
      // Macro
      "MACRO_SECTION",
      "MACRO_BLOCK",
      "MACRO_LINE",
      "MACRO_NAME",
      "MACRO_EXPRESSION",
      // Expression
      "EXPRESSION_SECTIONLIST",
      "EXPRESSION_SECTION",
      "EXPRESSION_BLOCK",
      "EXPRESSION_LINE",
      // Precedence
      "PRECEDENCE_SECTION",
      "PRECEDENCE_BLOCK",
      "PRECEDENCE_LINE",
      "OPT_NUM",
      "TERMINAL_LIST",
      "TERMINAL",
      "ASSOC",
      // Production
      "PRODUCTION_SECTION",
      "PRODUCTION_STARTLIST",
      "PRODUCTION_STARTSYMBOL",
      "PRODUCTION_STARTSYMBOLLIST",
      "PRODUCTION_BLOCK",
      "PRODUCTION_LINE",
      "PRODUCTION_LEFT",
      "PRODUCTION_LHSNAMELIST",
      "PRODUCTION_LHSNAME",
      "PRODUCTION_RIGHT",
      "PRODUCTION_RHS",
      "PRODUCTION_SYMBOLCOMBINE",
      "PRODUCTION_FULLSYMBOL",
      "PRODUCTION_PREFIX",
      "PRODUCTION_SYMBOL",
      "PRODUCTION_ERROR",
      "NONTERMINAL_LIST",
      "PRODUCTION_POSTFIX",
      "PRODUCTION_PREC",
      "PRODUCTION_REDUCE",
      "REDUCE_LIST",
      "REDUCE_EXPR",
      "REDUCE_NONTERMINAL_LIST",
      "REDUCE_TERMINAL_LIST",
      "NAMED_ERROR"
    };

    // Put in the terminals
    for (size_t i = 0u; i < terminalCount; ++i)
        grammarSymbols.insert_or_assign(terminalSet[i], unsigned(i));

    static constexpr size_t nonTerminalCount = 34u;
    static constexpr struct nonTerminalInfo {
        const char* pName;
        unsigned    Id;
    } nonTerminalSet[nonTerminalCount] =
    {
      {"%error",           SGL_TokenError},
      {"bad_char",         SGL_bad_char},
      {"number_int",       SGL_number_int},
      {"string_cons",      SGL_string_cons},
      {"identifier",       SGL_identifier},

      {"macro",            SGL_macro},

      {"expression",       SGL_expression},
      {"ignore",           SGL_ignore},
      {"push",             SGL_push},
      {"pop",              SGL_pop},
      {"goto",             SGL_goto},

      {"prec",             SGL_prec},
      {"left",             SGL_left},
      {"right",            SGL_right},
      {"nonassoc",         SGL_nonassoc},

      {"production",       SGL_production},
      {"shifton",          SGL_shifton},
      {"reduceon",         SGL_reduceon},
      {"reduce",           SGL_reduce},
      {"action",           SGL_action},
      {"error",            SGL_error},
      {"error_backtrack",  SGL_error_backtrack},

      {",",                SGL_comma},
      {";",                SGL_semicolon},
      {"?",                SGL_question},
      {"&",                SGL_and},
      {"|",                SGL_or},
      {"{",                SGL_curlyopen},
      {"}",                SGL_curlyclose},
      {"(",                SGL_lparen},
      {")",                SGL_rparen},
      {">",                SGL_greaterthan},
      {"->",               SGL_arrow},
      {"quote_cons",       SGL_quote_cons}
    };

    // Add all the nonterminals
    for (size_t i = 0u; i < nonTerminalCount; ++i)
        grammarSymbols.insert_or_assign(nonTerminalSet[i].pName,
                                        nonTerminalSet[i].Id | ProductionMask::Terminal);

    static constexpr size_t productionCount = 107u;
    static constexpr struct ProductionInit {
        const char* pName;
        const char* pGrammarSymbol;
        size_t      Length;
        const char* pRight[6u];
    } init[productionCount]=
    {

      {"RootBlock",                   "ROOT_BLOCK",                 4u, {"MACRO_SECTION", "EXPRESSION_SECTIONLIST", "PRECEDENCE_SECTION", "PRODUCTION_SECTION"} },
      {"RootBlockError",              "ROOT_BLOCK",                 1u, {"%error"}                                                                              },

      // Macro
      {"MacroSection",                "MACRO_SECTION",              2u, {"macro", "MACRO_BLOCK"}                                                                },
      {"MacroSectionError",           "MACRO_SECTION",              2u, {"macro", "%error"}                                                                     },
      {"MacroSectionEmpty",           "MACRO_SECTION",              0u, {}                                                                                      },

      {"MacroBlock",                  "MACRO_BLOCK",                2u, {"MACRO_BLOCK", "MACRO_LINE"}                                                           },
      {"MacroBlockEmpty",             "MACRO_BLOCK",                0u, {}                                                                                      },

      {"MacroLine",                   "MACRO_LINE",                 2u, {"MACRO_NAME", "MACRO_EXPRESSION"}                                                      },
      {"MacroLineError",              "MACRO_LINE",                 2u, {"%error", "MACRO_EXPRESSION"}                                                          },

      {"MacroName",                   "MACRO_NAME",                 3u, {"{", "identifier", "}"}                                                                },
      {"MacroNameError",              "MACRO_NAME",                 2u, {"%error", "}"}                                                                         },

      {"MacroExpr",                   "MACRO_EXPRESSION",           2u, {"quote_cons", ";"}                                                                     },
      {"MacroExprError",              "MACRO_EXPRESSION",           2u, {"%error", ";"}                                                                         },

      // Expression
      {"ExprSectionList",             "EXPRESSION_SECTIONLIST",     2u, {"EXPRESSION_SECTION", "EXPRESSION_SECTIONLIST"}                                        },
      {"ExprSectionListEmpty",        "EXPRESSION_SECTIONLIST",     0u, {}                                                                                      },

      {"ExprSection",                 "EXPRESSION_SECTION",         3u, {"expression", "identifier", "EXPRESSION_BLOCK"}                                        },
      {"ExprSectionError",            "EXPRESSION_SECTION",         2u, {"expression", "%error"}                                                                },

      {"ExprBlock",                   "EXPRESSION_BLOCK",           2u, {"EXPRESSION_BLOCK","EXPRESSION_LINE"}                                                  },
      {"ExprBlockEmpty",              "EXPRESSION_BLOCK",           0u, {}                                                                                      },

      {"ExprLine",                    "EXPRESSION_LINE",            4u, {"quote_cons", "identifier", "OPT_ACTION", ";"}                                         },
      {"ExprLineAlias",               "EXPRESSION_LINE",            6u, {"quote_cons", "identifier", ",", "quote_cons", "OPT_ACTION", ";"}                      },
      {"ExprLineIgnore",              "EXPRESSION_LINE",            4u, {"quote_cons", "ignore", "OPT_ACTION",";"}                                              },
      {"ExprLineError",               "EXPRESSION_LINE",            2u, {"%error", ";"}                                                                         },

      {"OptActionPush",               "OPT_ACTION",                 3u, {",","push","identifier"}                                                               },
      {"OptActionPop",                "OPT_ACTION",                 2u, {",","pop"}                                                                             },
      {"OptActionGoto",               "OPT_ACTION",                 3u, {",","goto","identifier"}                                                               },
      {"OptActionNone",               "OPT_ACTION",                 0u, {}                                                                                      },

      // Precedence
      {"PrecSection",                 "PRECEDENCE_SECTION",         2u, {"prec","PRECEDENCE_BLOCK"}                                                             },
      {"PrecSectionError",            "PRECEDENCE_SECTION",         2u, {"prec","%error"}                                                                       },
      {"PrecSectionEmpty",            "PRECEDENCE_SECTION",         0u, {}                                                                                      },

      {"PrecBlock",                   "PRECEDENCE_BLOCK",           2u, {"PRECEDENCE_BLOCK","PRECEDENCE_LINE"}                                                  },
      {"PrecBlockEmpty",              "PRECEDENCE_BLOCK",           0u, {}                                                                                      },

      {"PrecTerminalListAssoc1",      "PRECEDENCE_LINE",            4u, {"OPT_NUM", "TERMINAL_LIST", "ASSOC", ";"}                                              },
      {"PrecTerminalListAssoc2",      "PRECEDENCE_LINE",            5u, {"OPT_NUM", "TERMINAL_LIST", ",", "ASSOC", ";"}                                         },
      {"PrecAssocTerminalList1",      "PRECEDENCE_LINE",            4u, {"OPT_NUM", "ASSOC", "TERMINAL_LIST", ";"}                                              },
      {"PrecAssocTerminalList2",      "PRECEDENCE_LINE",            5u, {"OPT_NUM", "ASSOC", ",", "TERMINAL_LIST", ";"}                                         },
      {"PrecError",                   "PRECEDENCE_LINE",            2u, {"%error", ";"}                                                                         },

      {"Num",                         "OPT_NUM",                    1u, {"number_int"}                                                                          },
      {"NumComma",                    "OPT_NUM",                    2u, {"number_int", ","}                                                                     },
      {"NumEmpty",                    "OPT_NUM",                    0u, {}                                                                                      },

      {"TerminalOne",                 "TERMINAL_LIST",              1u, {"TERMINAL"}                                                                            },
      {"TerminalList",                "TERMINAL_LIST",              2u, {"TERMINAL_LIST", "TERMINAL"}                                                           },
      {"TerminalListComma",           "TERMINAL_LIST",              3u, {"TERMINAL_LIST", ",", "TERMINAL"}                                                      },

      {"Terminal",                    "TERMINAL",                   1u, {"identifier"}                                                                          },
      {"TerminalQuote",               "TERMINAL",                   1u, {"quote_cons"}                                                                          },

      {"AssocLeft",                   "ASSOC",                      1u, {"left"}                                                                                },
      {"AssocRight",                  "ASSOC",                      1u, {"right"}                                                                               },
      {"AssocNon",                    "ASSOC",                      1u, {"nonassoc"}                                                                            },

      // Production
      {"ProdSection",                 "PRODUCTION_SECTION",         2u, {"PRODUCTION_STARTLIST", "PRODUCTION_BLOCK"}                                            },
      {"ProdSectionEmpty",            "PRODUCTION_SECTION",         0u, {}                                                                                      },

      {"ProdStartNameList",           "PRODUCTION_STARTLIST",       1u, {"PRODUCTION_STARTSYMBOL"}                                                              },
      {"ProdStartNameListNested",     "PRODUCTION_STARTLIST",       2u, {"PRODUCTION_STARTSYMBOL", "PRODUCTION_STARTLIST"}                                      },

      {"ProdStartSymbolDecl",         "PRODUCTION_STARTSYMBOL",     2u, {"production", "PRODUCTION_STARTSYMBOLLIST"}                                            },
      {"ProdStartSymbolDeclError",    "PRODUCTION_STARTSYMBOL",     2u, {"production", "%error"}                                                                },

      {"ProdStartSymbolListId",       "PRODUCTION_STARTSYMBOLLIST", 1u, {"identifier"}                                                                          },
      {"ProdStartSymbolListNested",   "PRODUCTION_STARTSYMBOLLIST", 3u, {"PRODUCTION_STARTSYMBOLLIST", ",", "identifier"}                                       },

      {"ProdBlock",                   "PRODUCTION_BLOCK",           2u, {"PRODUCTION_BLOCK","PRODUCTION_LINE"}                                                  },
      {"ProdBlockEmpty",              "PRODUCTION_BLOCK",           0u, {}                                                                                      },

      {"ProdLine",                    "PRODUCTION_LINE",            2u, {"PRODUCTION_LEFT","PRODUCTION_RIGHT"},                                                 },

      {"ProdLeft",                    "PRODUCTION_LEFT",            3u, {"identifier", "PRODUCTION_LHSNAMELIST", "->"},                                         },
      {"ProdLeftError",               "PRODUCTION_LEFT",            2u, {"%error", "->"},                                                                       },

      {"ProdLHSNameList",             "PRODUCTION_LHSNAMELIST",     1u, {"PRODUCTION_LHSNAME"},                                                                 },
      {"ProdLHSNameListNested",       "PRODUCTION_LHSNAMELIST",     3u, {"PRODUCTION_LHSNAMELIST", "|", "PRODUCTION_LHSNAME"},                                  },

      {"ProdLHSId",                   "PRODUCTION_LHSNAME",         1u, {"identifier"},                                                                         },
      {"ProdLHSNamedError",           "PRODUCTION_LHSNAME",         2u, {"identifier", "NAMED_ERROR"},                                                          },

      {"ProdRight",                   "PRODUCTION_RIGHT",           3u, {"PRODUCTION_RHS", "PRODUCTION_POSTFIX", ";"}                                           },
      {"ProdRightError",              "PRODUCTION_RIGHT",           2u, {"%error", ";"}                                                                         },

      {"ProdRHS",                     "PRODUCTION_RHS",             2u, {"PRODUCTION_RHS", "PRODUCTION_SYMBOLCOMBINE"}                                          },
      {"ProdRHSErrorToken",           "PRODUCTION_RHS",             2u, {"PRODUCTION_RHS", "PRODUCTION_ERROR"}                                                  },
      {"ProdRHSEmpty",                "PRODUCTION_RHS",             0u, {}                                                                                      },

      {"ProdSymbolCombineSingle",     "PRODUCTION_SYMBOLCOMBINE",   1u, {"PRODUCTION_FULLSYMBOL"}                                                               },
      {"ProdSymbolCombine",           "PRODUCTION_SYMBOLCOMBINE",   3u, {"PRODUCTION_SYMBOLCOMBINE", "|", "PRODUCTION_FULLSYMBOL"}                              },

      {"ProdFullSymbol",              "PRODUCTION_FULLSYMBOL",      2u, {"PRODUCTION_PREFIX", "PRODUCTION_SYMBOL"}                                              },
      {"ProdFullSymbolError",         "PRODUCTION_FULLSYMBOL",      2u, {"%error", "PRODUCTION_SYMBOL"}                                                         },

      {"ProdPrefixShift",             "PRODUCTION_PREFIX",          5u, {"PRODUCTION_PREFIX", "shifton", "(", "NONTERMINAL_LIST", ")"}                          },
      {"ProdPrefixShiftError",        "PRODUCTION_PREFIX",          5u, {"PRODUCTION_PREFIX", "shifton", "(", "%error", ")"}                                    },
      {"ProdPrefixReduce",            "PRODUCTION_PREFIX",          5u, {"PRODUCTION_PREFIX", "reduceon", "(", "NONTERMINAL_LIST", ")"}                         },
      {"ProdPrefixReduceError",       "PRODUCTION_PREFIX",          5u, {"PRODUCTION_PREFIX", "reduceon", "(", "%error", ")"}                                   },
      {"ProdPrefixEmpty",             "PRODUCTION_PREFIX",          0u, {}                                                                                      },

      {"ProdSymbolId",                "PRODUCTION_SYMBOL",          1u, {"identifier"}                                                                          },
      {"ProdSymbolQuote",             "PRODUCTION_SYMBOL",          1u, {"quote_cons"}                                                                          },
      {"ProdSymbolAction",            "PRODUCTION_SYMBOL",          4u, {"action", "(", "identifier", ")"}                                                      },
      {"ProdSymbolActionError",       "PRODUCTION_SYMBOL",          4u, {"action", "(", "%error", ")"}                                                          },

      {"ProdRHSError",                "PRODUCTION_ERROR",           1u, {"error"}                                                                               },
      {"ProdRHSErrorBacktrack",       "PRODUCTION_ERROR",           1u, {"error_backtrack"}                                                                     },
      {"ProdRHSErrorNamed",           "PRODUCTION_ERROR",           1u, {"NAMED_ERROR"}                                                                         },

      {"NonterminalListId",           "NONTERMINAL_LIST",           1u, {"identifier"}                                                                          },
      {"NonterminalListNested1",      "NONTERMINAL_LIST",           2u, {"NONTERMINAL_LIST", "identifier"}                                                      },
      {"NonterminalListNested2",      "NONTERMINAL_LIST",           3u, {"NONTERMINAL_LIST", ",", "identifier"}                                                 },

      {"ProdPostfixPrecReduce",       "PRODUCTION_POSTFIX",         2u, {"PRODUCTION_PREC", "PRODUCTION_REDUCE"}                                                },
      {"ProdPostfixReducePrec",       "PRODUCTION_POSTFIX",         2u, {"PRODUCTION_REDUCE", "PRODUCTION_PREC"}                                                },
      {"ProdPostfixReduce",           "PRODUCTION_POSTFIX",         1u, {"PRODUCTION_REDUCE"}                                                                   },
      {"ProdPostfixPrec",             "PRODUCTION_POSTFIX",         1u, {"PRODUCTION_PREC"}                                                                     },
      {"ProdPostfixEmpty",            "PRODUCTION_POSTFIX",         0u, {}                                                                                      },

      {"ProdPrecId",                  "PRODUCTION_PREC",            2u, {"prec", "identifier"}                                                                  },
      {"ProdPrecQuote",               "PRODUCTION_PREC",            2u, {"prec", "quote_cons"}                                                                  },

      {"ProdReduce",                  "PRODUCTION_REDUCE",          4u, {"reduce", "(", "REDUCE_LIST", ")"}                                                     },

      {"ReduceList",                  "REDUCE_LIST",                1u, {"REDUCE_EXPR"}                                                                         },
      {"ReduceListNested",            "REDUCE_LIST",                3u, {"REDUCE_LIST", ",", "REDUCE_EXPR"}                                                     },
      {"ReduceExpr",                  "REDUCE_EXPR",                1u, {"REDUCE_NONTERMINAL_LIST"}                                                             },
      {"ReduceExprWithTerminals",     "REDUCE_EXPR",                3u, {"REDUCE_NONTERMINAL_LIST", "&", "REDUCE_TERMINAL_LIST"}                                },

      {"ReduceNonterminalList",       "REDUCE_NONTERMINAL_LIST",    1u, {"identifier"}                                                                          },
      {"ReduceNonterminalListNested", "REDUCE_NONTERMINAL_LIST",    2u, {"REDUCE_NONTERMINAL_LIST", "identifier"}                                               },

      {"ReduceTerminalList",          "REDUCE_TERMINAL_LIST",       1u, {"TERMINAL"}                                                                            },
      {"ReduceTerminalListNested",    "REDUCE_TERMINAL_LIST",       2u, {"REDUCE_TERMINAL_LIST", "TERMINAL"}                                                    },

      {"NamedError",                  "NAMED_ERROR",                4u, {"error", "(", "identifier", ")"}                                                       },
      {"NamedErrorError",             "NAMED_ERROR",                4u, {"error", "(", "%error", ")"}                                                           }
    };

    // Make a list of productions
    for (size_t i = 0u; i < productionCount; ++i) {
        unsigned arr[6u];
        for (size_t j = 0u; j < init[i].Length; ++j)
            if (init[i].pRight[j])
                arr[j] = grammarSymbols[init[i].pRight[j]];

        productions.emplace_back(init[i].pName, grammarSymbols[init[i].pGrammarSymbol],
                                 arr, unsigned(init[i].Length));
    }
}